

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O2

MPP_RET __thiscall Mpp::get_packet_async(Mpp *this,MppPacket *packet)

{
  RK_S32 RVar1;
  __pid_t _Var2;
  MPP_RET MVar3;
  void *__stat_loc;
  MppPacket pkt;
  pthread_mutex_t *local_38;
  AutoMutex autoPacketLock;
  
  autoPacketLock.mLock = (Mutex *)this->mPktOut;
  autoPacketLock.mEnabled = 1;
  if ((pthread_mutex_t *)autoPacketLock.mLock != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)autoPacketLock.mLock);
  }
  *packet = (MppPacket)0x0;
  RVar1 = mpp_list::list_size(this->mPktOut);
  if (RVar1 == 0) {
    __stat_loc = (void *)(ulong)(uint)this->mOutputTimeout;
    if (__stat_loc == (void *)0x0) {
      usleep(1000);
    }
    else if (this->mOutputTimeout < MPP_POLL_NON_BLOCK) {
      MppMutexCond::wait(&this->mPktOut->super_MppMutexCond,__stat_loc);
    }
    else {
      _Var2 = MppMutexCond::wait(&this->mPktOut->super_MppMutexCond,__stat_loc);
      if (_Var2 != 0) {
        MVar3 = -(uint)(_Var2 != 0x6e) | MPP_ERR_TIMEOUT;
        goto LAB_00138bb6;
      }
    }
  }
  RVar1 = mpp_list::list_size(this->mPktOut);
  if (RVar1 == 0) {
    local_38 = (pthread_mutex_t *)this->mFrmIn;
    pkt = (MppPacket)CONCAT44(pkt._4_4_,1);
    pthread_mutex_lock(local_38);
    RVar1 = mpp_list::list_size(this->mFrmIn);
    if (RVar1 != 0) {
      notify(this,1);
    }
    Mutex::Autolock::~Autolock((Autolock *)&pkt);
    MVar3 = MPP_NOK;
  }
  else {
    pkt = (MppPacket)0x0;
    mpp_list::del_at_head(this->mPktOut,&pkt,8);
    this->mPacketGetCount = this->mPacketGetCount + 1;
    notify(this,2);
    *packet = pkt;
    mpp_buffer_sync_partial_begin_f
              (*(MppBuffer *)((long)pkt + 0x40),1,
               *(int *)((long)pkt + 0x10) - *(int *)((long)pkt + 8),*(RK_U32 *)((long)pkt + 0x20),
               "get_packet_async");
    MVar3 = MPP_OK;
  }
LAB_00138bb6:
  Mutex::Autolock::~Autolock(&autoPacketLock);
  return MVar3;
}

Assistant:

MPP_RET Mpp::get_packet_async(MppPacket *packet)
{
    AutoMutex autoPacketLock(mPktOut->mutex());

    *packet = NULL;
    if (0 == mPktOut->list_size()) {
        if (mOutputTimeout) {
            if (mOutputTimeout < 0) {
                /* block wait */
                mPktOut->wait();
            } else {
                RK_S32 ret = mPktOut->wait(mOutputTimeout);
                if (ret) {
                    if (ret == ETIMEDOUT)
                        return MPP_ERR_TIMEOUT;
                    else
                        return MPP_NOK;
                }
            }
        } else {
            /* NOTE: in non-block mode the sleep is to avoid user's dead loop */
            msleep(1);
        }
    }

    if (mPktOut->list_size()) {
        MppPacket pkt = NULL;
        MppPacketImpl *impl = NULL;
        RK_U32 offset;

        mPktOut->del_at_head(&pkt, sizeof(pkt));
        mPacketGetCount++;
        notify(MPP_OUTPUT_DEQUEUE);

        *packet = pkt;

        impl = (MppPacketImpl *)pkt;
        offset = (RK_U32)((char *)impl->pos - (char *)impl->data);
        mpp_buffer_sync_ro_partial_begin(impl->buffer, offset, impl->length);
    } else {
        AutoMutex autoFrameLock(mFrmIn->mutex());

        if (mFrmIn->list_size())
            notify(MPP_INPUT_ENQUEUE);

        return MPP_NOK;
    }

    return MPP_OK;
}